

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O2

pair<double,_double>
Function_Template::template_Invert(InvertForm2 Invert,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer timer;
  
  Test_Helper::uniformImages(&image,2,size,size);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&timer);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&timer);
    (*Invert)(image.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
              image.
              super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1);
    Performance_Test::TimerContainer::stop(&timer);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean(&timer.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&timer.super_BaseTimerContainer);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&image);
  return pVar3;
}

Assistant:

std::pair < double, double > template_Invert( InvertForm2 Invert, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );

        TEST_FUNCTION_LOOP( Invert( image[0], image[1] ), namespaceName )
    }